

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::Curve::ToString_abi_cxx11_(Curve *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  float *in_stack_00000018;
  CurveCommon *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::CurveCommon_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string Curve::ToString() const {
    return StringPrintf("[ Curve common: %s uMin: %f uMax: %f ]", *common, uMin, uMax);
}